

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

void __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::ExternalInterface::store
          (ExternalInterface *this,Store *store,Address addr,Literal *value,Name memory)

{
  uint8_t uVar1;
  BasicType BVar2;
  int32_t iVar3;
  float fVar4;
  uint uVar5;
  int64_t iVar6;
  ulong uVar7;
  ushort uVar8;
  size_t sVar9;
  _func_int *UNRECOVERED_JUMPTABLE;
  anon_union_4_2_5fd15f10 fp32_1;
  float fVar10;
  undefined1 local_48 [16];
  char *local_38;
  
  local_38 = memory.super_IString.str._M_str;
  sVar9 = memory.super_IString.str._M_len;
  BVar2 = Type::getBasic(&store->valueType);
  switch(BVar2) {
  case none:
  case unreachable:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0xb56);
  case i32:
    uVar1 = store->bytes;
    if (uVar1 != '\x04') {
      if (uVar1 == '\x02') {
        iVar3 = Literal::geti32(value);
        UNRECOVERED_JUMPTABLE = this->_vptr_ExternalInterface[0x17];
        uVar7 = (ulong)(uint)(int)(short)iVar3;
      }
      else {
        if (uVar1 != '\x01') {
          wasm::handle_unreachable
                    ("invalid store size",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,0xb25);
        }
        iVar3 = Literal::geti32(value);
        UNRECOVERED_JUMPTABLE = this->_vptr_ExternalInterface[0x16];
        uVar7 = (ulong)(uint)(int)(char)iVar3;
      }
      goto LAB_00137e72;
    }
    uVar5 = Literal::geti32(value);
    break;
  case i64:
    switch(store->bytes) {
    case '\x01':
      iVar6 = Literal::geti64(value);
      UNRECOVERED_JUMPTABLE = this->_vptr_ExternalInterface[0x16];
      uVar7 = (ulong)(uint)(int)(char)iVar6;
      break;
    case '\x02':
      iVar6 = Literal::geti64(value);
      UNRECOVERED_JUMPTABLE = this->_vptr_ExternalInterface[0x17];
      uVar7 = (ulong)(uint)(int)(short)iVar6;
      break;
    default:
      wasm::handle_unreachable
                ("invalid store size",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0xb38);
    case '\x04':
      uVar7 = Literal::geti64(value);
      UNRECOVERED_JUMPTABLE = this->_vptr_ExternalInterface[0x18];
      uVar7 = uVar7 & 0xffffffff;
      break;
    case '\b':
      iVar6 = Literal::geti64(value);
      goto LAB_00137dc1;
    }
    goto LAB_00137e72;
  case f32:
    if (store->bytes != '\x04') {
      if (store->bytes == '\x02') {
        fVar4 = (float)Literal::reinterpreti32(value);
        fVar10 = 2.0;
        if (0x70ffffff < (uint)((int)fVar4 * 2)) {
          fVar10 = (float)(((uint)fVar4 & 0x7f800000) + 0x7800000);
        }
        fVar10 = fVar10 + ABS(fVar4) * 5.192297e+33 * 7.70372e-34;
        uVar8 = 0x7e00;
        if ((uint)((int)fVar4 * 2) < 0xff000001) {
          uVar8 = (SUB42(fVar10,0) & 0xfff) + ((ushort)((uint)fVar10 >> 0xd) & 0x7c00);
        }
        (*this->_vptr_ExternalInterface[0x17])
                  (this,addr.addr,
                   (ulong)(uint)(int)(short)(uVar8 | (ushort)((uint)fVar4 >> 0x10) & 0x8000),sVar9,
                   local_38);
        return;
      }
      wasm::handle_unreachable
                ("invalid store size",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0xb4a);
    }
    uVar5 = Literal::reinterpreti32(value);
    break;
  case f64:
    iVar6 = Literal::reinterpreti64(value);
LAB_00137dc1:
    (*this->_vptr_ExternalInterface[0x19])
              (this,addr.addr,iVar6,sVar9,local_38,this->_vptr_ExternalInterface[0x19]);
    return;
  case v128:
    local_48 = wasm::Literal::getv128();
    (*this->_vptr_ExternalInterface[0x1a])(this,addr.addr,local_48,sVar9,local_38);
  default:
    return;
  }
  UNRECOVERED_JUMPTABLE = this->_vptr_ExternalInterface[0x18];
  uVar7 = (ulong)uVar5;
LAB_00137e72:
  (*UNRECOVERED_JUMPTABLE)(this,addr.addr,uVar7,sVar9,local_38,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

virtual void store(Store* store, Address addr, Literal value, Name memory) {
      switch (store->valueType.getBasic()) {
        case Type::i32: {
          switch (store->bytes) {
            case 1:
              store8(addr, value.geti32(), memory);
              break;
            case 2:
              store16(addr, value.geti32(), memory);
              break;
            case 4:
              store32(addr, value.geti32(), memory);
              break;
            default:
              WASM_UNREACHABLE("invalid store size");
          }
          break;
        }
        case Type::i64: {
          switch (store->bytes) {
            case 1:
              store8(addr, value.geti64(), memory);
              break;
            case 2:
              store16(addr, value.geti64(), memory);
              break;
            case 4:
              store32(addr, value.geti64(), memory);
              break;
            case 8:
              store64(addr, value.geti64(), memory);
              break;
            default:
              WASM_UNREACHABLE("invalid store size");
          }
          break;
        }
        // write floats carefully, ensuring all bits reach memory
        case Type::f32: {
          switch (store->bytes) {
            case 2: {
              float f32 = bit_cast<float>(value.reinterpreti32());
              // Convert the float32 to float16 and store the binary
              // representation.
              store16(addr, fp16_ieee_from_fp32_value(f32), memory);
              break;
            }
            case 4:
              store32(addr, value.reinterpreti32(), memory);
              break;
            default:
              WASM_UNREACHABLE("invalid store size");
          }
          break;
        }
        case Type::f64:
          store64(addr, value.reinterpreti64(), memory);
          break;
        case Type::v128:
          store128(addr, value.getv128(), memory);
          break;
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
    }